

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableNT.cpp
# Opt level: O3

DataType __thiscall adios2::VariableNT::StructFieldType(VariableNT *this,size_t index)

{
  DataType DVar1;
  long *plVar2;
  VariableBase *pVVar3;
  long *plVar4;
  size_type *psVar5;
  ulong uVar6;
  string local_110;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  string local_d0;
  string local_b0;
  string local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  pVVar3 = this->m_Variable;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"in call to VariableNT::StructFieldType","");
  helper::CheckForNullptr<adios2::core::VariableBase>(pVVar3,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pVVar3 = this->m_Variable;
  if (*(int *)(pVVar3 + 0x28) != 0x10) {
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"bindings::CXX11","");
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"VariableNT","");
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"StructFieldType","");
    adios2::ToString_abi_cxx11_((DataType)local_70);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x1e64d5);
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_e0 = *plVar4;
      lStack_d8 = plVar2[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar4;
      local_f0 = (long *)*plVar2;
    }
    local_e8 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_f0);
    psVar5 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_d0.field_2._M_allocated_capacity = *psVar5;
      local_d0.field_2._8_8_ = plVar2[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar5;
      local_d0._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_d0._M_string_length = plVar2[1];
    *plVar2 = (long)psVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    helper::Throw<std::runtime_error>(&local_110,&local_90,&local_b0,&local_d0,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    pVVar3 = this->m_Variable;
  }
  uVar6 = *(ulong *)(pVVar3 + 0x248);
  if (uVar6 == 0) {
    uVar6 = *(ulong *)(pVVar3 + 0x240);
  }
  DVar1 = adios2::core::StructDefinition::Type(uVar6);
  return DVar1;
}

Assistant:

DataType VariableNT::StructFieldType(const size_t index) const
{
    helper::CheckForNullptr(m_Variable, "in call to VariableNT::StructFieldType");
    if (m_Variable->m_Type != DataType::Struct)
    {
        helper::Throw<std::runtime_error>("bindings::CXX11", "VariableNT", "StructFieldType",
                                          "invalid data type " + ToString(m_Variable->m_Type) +
                                              ", only Struct type supports this API");
    }
    if (reinterpret_cast<core::VariableStruct *>(m_Variable)->m_ReadStructDefinition)
        return reinterpret_cast<core::VariableStruct *>(m_Variable)
            ->m_ReadStructDefinition->Type(index);
    else
        return reinterpret_cast<core::VariableStruct *>(m_Variable)
            ->m_WriteStructDefinition->Type(index);
}